

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_buffer.cpp
# Opt level: O1

void __thiscall
duckdb::FixedSizeBuffer::FixedSizeBuffer
          (FixedSizeBuffer *this,BlockManager *block_manager,idx_t segment_count,
          idx_t allocation_size,BlockPointer *block_pointer)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint32_t uVar1;
  uint32_t uVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  this->block_manager = block_manager;
  this->segment_count = segment_count;
  this->allocation_size = allocation_size;
  this->dirty = false;
  this->vacuum = false;
  uVar1 = block_pointer->offset;
  uVar2 = block_pointer->unused_padding;
  (this->block_pointer).block_id = block_pointer->block_id;
  (this->block_pointer).offset = uVar1;
  (this->block_pointer).unused_padding = uVar2;
  BufferHandle::BufferHandle(&this->buffer_handle);
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  (this->block_handle).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->block_handle).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  BlockManager::RegisterBlock((BlockManager *)&stack0xffffffffffffffc8,(block_id_t)block_manager);
  p_Var4 = p_Stack_30;
  peVar3 = local_38;
  local_38 = (element_type *)0x0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->block_handle).internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->block_handle).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar3;
  (this->block_handle).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var4;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  return;
}

Assistant:

FixedSizeBuffer::FixedSizeBuffer(BlockManager &block_manager, const idx_t segment_count, const idx_t allocation_size,
                                 const BlockPointer &block_pointer)
    : block_manager(block_manager), segment_count(segment_count), allocation_size(allocation_size), dirty(false),
      vacuum(false), block_pointer(block_pointer) {

	D_ASSERT(block_pointer.IsValid());
	block_handle = block_manager.RegisterBlock(block_pointer.block_id);
	D_ASSERT(block_handle->BlockId() < MAXIMUM_BLOCK);
}